

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall TPZSkylMatrix<double>::Clear(TPZSkylMatrix<double> *this)

{
  long in_RDI;
  int64_t in_stack_00000018;
  TPZVec<double_*> *in_stack_00000020;
  
  TPZVec<double>::Resize((TPZVec<double> *)in_stack_00000020,in_stack_00000018);
  TPZVec<double_*>::Resize(in_stack_00000020,in_stack_00000018);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Clear()
{
    this->fStorage.Resize(0);
    //	fStorage.Shrink();
    this->fElem.Resize(0);
    this->fRow = this->fCol = 0;
    this->fDecomposed = 0;
    return( 1 );
}